

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Enum
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  int iVar1;
  EnumValueDescriptor *this_00;
  string *element_name;
  EnumValueDescriptorProto *descriptor;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *enm_local;
  DescriptorBuilder *this_local;
  
  iVar1 = EnumDescriptor::value_count(enm);
  if (0 < iVar1) {
    this_00 = EnumDescriptor::value(enm,0);
    iVar1 = EnumValueDescriptor::number(this_00);
    if (iVar1 != 0) {
      element_name = EnumDescriptor::full_name_abi_cxx11_(enm);
      descriptor = EnumDescriptorProto::value(proto,0);
      AddError(this,element_name,&descriptor->super_Message,NUMBER,
               "The first enum value must be zero in proto3.");
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Enum(EnumDescriptor* enm,
                                           const EnumDescriptorProto& proto) {
  if (enm->value_count() > 0 && enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero in proto3.");
  }
}